

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,short,duckdb::hugeint_t>
          (LogicalType *by_type,LogicalType *type)

{
  PhysicalType PVar1;
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *function;
  LogicalType *in_stack_000000a8;
  LogicalType *in_stack_000000b0;
  LogicalType *in_stack_000000b8;
  AggregateFunction *pAVar2;
  LogicalType local_38 [31];
  undefined1 local_19;
  LogicalType *local_18;
  LogicalType *local_10;
  
  local_19 = 0;
  pAVar2 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_38,in_RDX);
  AggregateFunction::
  BinaryAggregate<duckdb::ArgMinMaxState<short,duckdb::hugeint_t>,short,duckdb::hugeint_t,short,duckdb::ArgMinMaxBase<duckdb::LessThan,false>,(duckdb::AggregateDestructorType)1>
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  duckdb::LogicalType::~LogicalType(local_38);
  PVar1 = LogicalType::InternalType(local_18);
  if ((PVar1 == VARCHAR) || (PVar1 = LogicalType::InternalType(local_10), PVar1 == VARCHAR)) {
    in_RDI->destructor =
         AggregateFunction::
         StateDestroy<duckdb::ArgMinMaxState<short,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
    ;
  }
  in_RDI->bind = ArgMinMaxBase<duckdb::LessThan,_false>::Bind;
  return pAVar2;
}

Assistant:

AggregateFunction GetArgMinMaxFunctionInternal(const LogicalType &by_type, const LogicalType &type) {
#ifndef DUCKDB_SMALLER_BINARY
	using STATE = ArgMinMaxState<ARG_TYPE, BY_TYPE>;
	auto function =
	    AggregateFunction::BinaryAggregate<STATE, ARG_TYPE, BY_TYPE, ARG_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, by_type, type);
	if (type.InternalType() == PhysicalType::VARCHAR || by_type.InternalType() == PhysicalType::VARCHAR) {
		function.destructor = AggregateFunction::StateDestroy<STATE, OP>;
	}
	function.bind = OP::Bind;
#else
	auto function = GetGenericArgMinMaxFunction<OP>();
	function.arguments = {type, by_type};
	function.return_type = type;
#endif
	return function;
}